

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O2

void __thiscall QTeamCityLogger::stopLogging(QTeamCityLogger *this)

{
  long in_FS_OFFSET;
  QTestCharBuffer buf;
  QTestCharBuffer local_228;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_228,0xaa,0x210);
  local_228._size = 0x200;
  local_228.buf = local_228.staticBuf;
  local_228.staticBuf[0] = '\0';
  QTest::qt_asprintf(&local_228,"##teamcity[testSuiteFinished name=\'%s\' flowId=\'%s\']\n",
                     (this->flowID).buf);
  QAbstractTestLogger::outputString(&this->super_QAbstractTestLogger,local_228.buf);
  QAbstractTestLogger::stopLogging(&this->super_QAbstractTestLogger);
  QTestCharBuffer::~QTestCharBuffer(&local_228);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTeamCityLogger::stopLogging()
{
    QTestCharBuffer buf;
    QTest::qt_asprintf(&buf, "##teamcity[testSuiteFinished name='%s' flowId='%s']\n",
                       flowID.constData(), flowID.constData());
    outputString(buf.constData());

    QAbstractTestLogger::stopLogging();
}